

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QUuid __thiscall QVariant::toUuid(QVariant *this)

{
  long lVar1;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QUuid QVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = qvariant_cast<QUuid>(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QUuid QVariant::toUuid() const
{
    return qvariant_cast<QUuid>(*this);
}